

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O2

DdManager * cuddInitTable(uint numVars,uint numVarsZ,uint numSlots,uint looseUpTo)

{
  size_t sVar1;
  void *pvVar2;
  byte bVar3;
  uint value;
  int iVar4;
  int iVar5;
  int iVar6;
  DdManager *__ptr;
  DdSubtable *pDVar7;
  DdSubtable *pDVar8;
  DdSubtable *__ptr_00;
  DdSubtable *__ptr_01;
  DdSubtable *__ptr_02;
  DdSubtable *pDVar9;
  DdNode **ppDVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  
  __ptr = (DdManager *)malloc(0x2f8);
  if (__ptr != (DdManager *)0x0) {
    (__ptr->sentinel).type.value = 0.0;
    (__ptr->sentinel).type.kids.E = (DdNode *)0x0;
    (__ptr->sentinel).index = 0;
    (__ptr->sentinel).ref = 0;
    (__ptr->sentinel).next = (DdNode *)0x0;
    __ptr->epsilon = 1e-12;
    __ptr->maxGrowth = 1.1;
    __ptr->maxGrowthAlt = 2.2;
    __ptr->reordCycle = 0;
    __ptr->size = numVars;
    __ptr->sizeZ = numVarsZ;
    uVar12 = 10;
    if (10 < numVars) {
      uVar12 = numVars;
    }
    __ptr->maxSize = uVar12;
    uVar12 = 10;
    if (10 < numVarsZ) {
      uVar12 = numVarsZ;
    }
    __ptr->maxSizeZ = uVar12;
    uVar12 = 8;
    do {
      value = uVar12;
      uVar12 = value * 2;
    } while (value < numSlots);
    __ptr->initSlots = value;
    iVar4 = cuddComputeFloorLog2(value);
    uVar12 = (numVars + numVarsZ + 1) * value;
    __ptr->slots = uVar12;
    __ptr->maxLive = 0xffffffff;
    __ptr->keys = 0;
    __ptr->keysZ = 0;
    __ptr->dead = 0;
    __ptr->deadZ = 0;
    __ptr->gcFrac = 4.0;
    __ptr->minDead = uVar12 * 4;
    __ptr->looseUpTo = looseUpTo;
    __ptr->gcEnabled = 1;
    __ptr->allocated = 0;
    __ptr->reclaimed = 0.0;
    iVar5 = __ptr->maxSize;
    pDVar7 = (DdSubtable *)malloc((long)iVar5 * 0x38);
    __ptr->subtables = pDVar7;
    if (pDVar7 != (DdSubtable *)0x0) {
      iVar6 = __ptr->maxSizeZ;
      pDVar8 = (DdSubtable *)malloc((long)iVar6 * 0x38);
      __ptr->subtableZ = pDVar8;
      if (pDVar8 != (DdSubtable *)0x0) {
        sVar1 = (long)iVar5 * 4;
        __ptr_00 = (DdSubtable *)malloc(sVar1);
        __ptr->perm = (int *)__ptr_00;
        if (__ptr_00 == (DdSubtable *)0x0) {
          free(pDVar7);
          pDVar7 = pDVar8;
        }
        else {
          __ptr_01 = (DdSubtable *)malloc(sVar1);
          __ptr->invperm = (int *)__ptr_01;
          if (__ptr_01 == (DdSubtable *)0x0) {
            free(pDVar7);
            free(pDVar8);
            pDVar7 = __ptr_00;
          }
          else {
            sVar1 = (long)iVar6 * 4;
            __ptr_02 = (DdSubtable *)malloc(sVar1);
            __ptr->permZ = (int *)__ptr_02;
            if (__ptr_02 == (DdSubtable *)0x0) {
              free(pDVar7);
              free(pDVar8);
              free(__ptr_00);
              pDVar7 = __ptr_01;
            }
            else {
              pDVar9 = (DdSubtable *)malloc(sVar1);
              __ptr->invpermZ = (int *)pDVar9;
              if (pDVar9 == (DdSubtable *)0x0) {
                free(pDVar7);
                free(pDVar8);
                free(__ptr_00);
                free(__ptr_01);
                pDVar7 = __ptr_02;
              }
              else {
                __ptr->map = (int *)0x0;
                if (iVar5 < iVar6) {
                  iVar5 = iVar6;
                }
                ppDVar10 = (DdNode **)malloc((long)iVar5 * 8 + 8);
                __ptr->stack = ppDVar10;
                if (ppDVar10 == (DdNode **)0x0) {
                  free(pDVar7);
                  free(pDVar8);
                  free(__ptr_00);
                  free(__ptr_01);
                  free(__ptr_02);
                  pDVar7 = pDVar9;
                }
                else {
                  *ppDVar10 = (DdNode *)0x0;
                  iVar5 = cuddComputeFloorLog2(looseUpTo >> 2);
                  bVar3 = (byte)iVar5 & 0x1f;
                  uVar12 = 1 << bVar3;
                  __ptr->deathRowDepth = uVar12;
                  ppDVar10 = (DdNode **)malloc((long)(int)uVar12 << 3);
                  __ptr->deathRow = ppDVar10;
                  if (ppDVar10 != (DdNode **)0x0) {
                    iVar4 = 0x20 - iVar4;
                    uVar11 = 0;
                    uVar13 = 0;
                    if (0 < 1 << bVar3) {
                      uVar13 = (ulong)uVar12;
                    }
                    for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
                      __ptr->deathRow[uVar11] = (DdNode *)0x0;
                    }
                    __ptr->nextDead = 0;
                    __ptr->deadMask = uVar12 - 1;
                    uVar12 = value * 4;
                    uVar13 = (ulong)value;
                    sVar1 = uVar13 * 8;
                    uVar11 = (ulong)numVars;
                    for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
                      pDVar7 = __ptr->subtables;
                      pDVar7[uVar15].slots = value;
                      pDVar7[uVar15].shift = iVar4;
                      pDVar7[uVar15].keys = 0;
                      pDVar7[uVar15].dead = 0;
                      pDVar7[uVar15].maxKeys = uVar12;
                      ppDVar10 = (DdNode **)malloc(sVar1);
                      pDVar7[uVar15].varToBeGrouped = CUDD_LAZY_NONE;
                      pDVar8 = pDVar7 + uVar15;
                      pDVar8->bindVar = 0;
                      pDVar8->varType = CUDD_VAR_PRIMARY_INPUT;
                      *(undefined8 *)(&pDVar8->bindVar + 2) = 0;
                      pDVar7[uVar15].nodelist = ppDVar10;
                      if (ppDVar10 == (DdNode **)0x0) {
                        lVar16 = 0;
                        while (bVar17 = uVar15 != 0, uVar15 = uVar15 - 1, bVar17) {
                          pvVar2 = *(void **)((long)&pDVar7->nodelist + lVar16);
                          if (pvVar2 != (void *)0x0) {
                            free(pvVar2);
                            pDVar7 = __ptr->subtables;
                            *(undefined8 *)((long)&pDVar7->nodelist + lVar16) = 0;
                          }
                          lVar16 = lVar16 + 0x38;
                        }
                        goto LAB_00660929;
                      }
                      for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
                        ppDVar10[uVar14] = (DdNode *)__ptr;
                      }
                      __ptr->perm[uVar15] = (int)uVar15;
                      __ptr->invperm[uVar15] = (int)uVar15;
                    }
                    uVar15 = 0;
LAB_00660881:
                    if (uVar15 == numVarsZ) {
                      (__ptr->constants).slots = value;
                      (__ptr->constants).shift = iVar4;
                      (__ptr->constants).keys = 0;
                      (__ptr->constants).dead = 0;
                      (__ptr->constants).maxKeys = uVar12;
                      ppDVar10 = (DdNode **)malloc(sVar1);
                      (__ptr->constants).nodelist = ppDVar10;
                      if (ppDVar10 != (DdNode **)0x0) {
                        for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
                          ppDVar10[uVar11] = (DdNode *)0x0;
                        }
                        __ptr->memoryList = (DdNode **)0x0;
                        __ptr->nextFree = (DdNode *)0x0;
                        iVar5 = __ptr->maxSize;
                        iVar4 = __ptr->maxSizeZ;
                        iVar6 = iVar5;
                        if (iVar5 < iVar4) {
                          iVar6 = iVar4;
                        }
                        __ptr->memused =
                             (long)(iVar4 + iVar5) * 0x40 + (ulong)(value * (numVars + 1)) * 8 +
                             (long)iVar6 * 8 + 0x300 + (long)__ptr->deathRowDepth * 8;
                        __ptr->autoDyn = 0;
                        __ptr->autoDynZ = 0;
                        __ptr->autoMethod = CUDD_REORDER_SIFT;
                        __ptr->autoMethodZ = CUDD_REORDER_SIFT;
                        __ptr->realign = 0;
                        __ptr->realignZ = 0;
                        __ptr->nextDyn = 0xfa4;
                        __ptr->countDead = 0xffffffff;
                        __ptr->reordered = 0;
                        __ptr->reorderings = 0;
                        __ptr->siftMaxVar = 1000;
                        __ptr->siftMaxSwap = 2000000;
                        __ptr->tree = (MtrNode *)0x0;
                        __ptr->treeZ = (MtrNode *)0x0;
                        __ptr->groupcheck = CUDD_GROUP_CHECK7;
                        __ptr->linear = (long *)0x0;
                        __ptr->linearSize = 0;
                        __ptr->univ = (DdNode **)0x0;
                        __ptr->recomb = 0;
                        __ptr->symmviolation = 0;
                        __ptr->arcviolation = 0;
                        __ptr->populationSize = 0;
                        __ptr->populationSize = 0;
                        __ptr->numberXovers = 0;
                        __ptr->localCaches = (DdLocalCache *)0x0;
                        __ptr->preGCHook = (DdHook *)0x0;
                        __ptr->postGCHook = (DdHook *)0x0;
                        __ptr->preReorderingHook = (DdHook *)0x0;
                        __ptr->postReorderingHook = (DdHook *)0x0;
                        __ptr->out = _stdout;
                        __ptr->err = _stderr;
                        __ptr->errorCode = CUDD_NO_ERROR;
                        __ptr->maxmemhard = 0xffffffffffffffff;
                        __ptr->garbageCollections = 0;
                        __ptr->peakLiveNodes = 0;
                        __ptr->GCTime = 0;
                        __ptr->reordTime = 0;
                        return __ptr;
                      }
                      for (lVar16 = 0; pDVar7 = __ptr->subtables, uVar11 * 0x38 - lVar16 != 0;
                          lVar16 = lVar16 + 0x38) {
                        pvVar2 = *(void **)((long)&pDVar7->nodelist + lVar16);
                        if (pvVar2 != (void *)0x0) {
                          free(pvVar2);
                          *(undefined8 *)((long)&__ptr->subtables->nodelist + lVar16) = 0;
                        }
                      }
                      if (pDVar7 != (DdSubtable *)0x0) {
                        free(pDVar7);
                        __ptr->subtables = (DdSubtable *)0x0;
                      }
                      for (lVar16 = 0; pDVar7 = __ptr->subtableZ,
                          (ulong)numVarsZ * 0x38 - lVar16 != 0; lVar16 = lVar16 + 0x38) {
                        pvVar2 = *(void **)((long)&pDVar7->nodelist + lVar16);
                        if (pvVar2 != (void *)0x0) {
                          free(pvVar2);
                          *(undefined8 *)((long)&__ptr->subtableZ->nodelist + lVar16) = 0;
                        }
                      }
                    }
                    else {
                      pDVar7 = __ptr->subtableZ;
                      pDVar7[uVar15].slots = value;
                      pDVar7[uVar15].shift = iVar4;
                      pDVar7[uVar15].keys = 0;
                      pDVar7[uVar15].dead = 0;
                      pDVar7[uVar15].maxKeys = uVar12;
                      ppDVar10 = (DdNode **)malloc(sVar1);
                      pDVar7[uVar15].nodelist = ppDVar10;
                      if (ppDVar10 != (DdNode **)0x0) goto code_r0x006608d1;
                      for (lVar16 = 0; pDVar7 = __ptr->subtables, uVar11 * 0x38 - lVar16 != 0;
                          lVar16 = lVar16 + 0x38) {
                        pvVar2 = *(void **)((long)&pDVar7->nodelist + lVar16);
                        if (pvVar2 != (void *)0x0) {
                          free(pvVar2);
                          *(undefined8 *)((long)&__ptr->subtables->nodelist + lVar16) = 0;
                        }
                      }
                      if (pDVar7 != (DdSubtable *)0x0) {
                        free(pDVar7);
                        __ptr->subtables = (DdSubtable *)0x0;
                      }
                      lVar16 = 0;
                      while( true ) {
                        pDVar7 = __ptr->subtableZ;
                        bVar17 = uVar15 == 0;
                        uVar15 = uVar15 - 1;
                        if (bVar17) break;
                        pvVar2 = *(void **)((long)&pDVar7->nodelist + lVar16);
                        if (pvVar2 != (void *)0x0) {
                          free(pvVar2);
                          *(undefined8 *)((long)&__ptr->subtableZ->nodelist + lVar16) = 0;
                        }
                        lVar16 = lVar16 + 0x38;
                      }
                    }
                    goto LAB_0066093d;
                  }
                  pDVar7 = __ptr->subtables;
                  if (pDVar7 != (DdSubtable *)0x0) {
LAB_00660929:
                    free(pDVar7);
                    __ptr->subtables = (DdSubtable *)0x0;
                  }
                  pDVar7 = __ptr->subtableZ;
LAB_0066093d:
                  if (pDVar7 != (DdSubtable *)0x0) {
                    free(pDVar7);
                    __ptr->subtableZ = (DdSubtable *)0x0;
                  }
                  if (__ptr->perm != (int *)0x0) {
                    free(__ptr->perm);
                    __ptr->perm = (int *)0x0;
                  }
                  if (__ptr->invperm != (int *)0x0) {
                    free(__ptr->invperm);
                    __ptr->invperm = (int *)0x0;
                  }
                  if (__ptr->permZ != (int *)0x0) {
                    free(__ptr->permZ);
                    __ptr->permZ = (int *)0x0;
                  }
                  if (__ptr->invpermZ != (int *)0x0) {
                    free(__ptr->invpermZ);
                    __ptr->invpermZ = (int *)0x0;
                  }
                  pDVar7 = (DdSubtable *)__ptr->stack;
                }
              }
            }
          }
        }
      }
      free(pDVar7);
    }
    free(__ptr);
  }
  return (DdManager *)0x0;
code_r0x006608d1:
  for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
    ppDVar10[uVar14] = (DdNode *)0x0;
  }
  __ptr->permZ[uVar15] = (int)uVar15;
  __ptr->invpermZ[uVar15] = (int)uVar15;
  uVar15 = uVar15 + 1;
  goto LAB_00660881;
}

Assistant:

DdManager *
cuddInitTable(
  unsigned int numVars  /* Initial number of BDD variables (and subtables) */,
  unsigned int numVarsZ /* Initial number of ZDD variables (and subtables) */,
  unsigned int numSlots /* Initial size of the BDD subtables */,
  unsigned int looseUpTo /* Limit for fast table growth */)
{
    DdManager   *unique = ABC_ALLOC(DdManager,1);
    int         i, j;
    DdNodePtr   *nodelist;
    DdNode      *sentinel;
    unsigned int slots;
    int shift;

    if (unique == NULL) {
        return(NULL);
    }
    sentinel = &(unique->sentinel);
    sentinel->ref = 0;
    sentinel->index = 0;
    cuddT(sentinel) = NULL;
    cuddE(sentinel) = NULL;
    sentinel->next = NULL;
    unique->epsilon = DD_EPSILON;
    unique->maxGrowth = DD_MAX_REORDER_GROWTH;
    unique->maxGrowthAlt = 2.0 * DD_MAX_REORDER_GROWTH;
    unique->reordCycle = 0;     /* do not use alternate threshold */
    unique->size = numVars;
    unique->sizeZ = numVarsZ;
    unique->maxSize = ddMax(DD_DEFAULT_RESIZE, numVars);
    unique->maxSizeZ = ddMax(DD_DEFAULT_RESIZE, numVarsZ);

    /* Adjust the requested number of slots to a power of 2. */
    slots = 8;
    while (slots < numSlots) {
        slots <<= 1;
    }
    unique->initSlots = slots;
    shift = sizeof(int) * 8 - cuddComputeFloorLog2(slots);

    unique->slots = (numVars + numVarsZ + 1) * slots;
    unique->keys = 0;
    unique->maxLive = ~0;       /* very large number */
    unique->keysZ = 0;
    unique->dead = 0;
    unique->deadZ = 0;
    unique->gcFrac = DD_GC_FRAC_HI;
    unique->minDead = (unsigned) (DD_GC_FRAC_HI * (double) unique->slots);
    unique->looseUpTo = looseUpTo;
    unique->gcEnabled = 1;
    unique->allocated = 0;
    unique->reclaimed = 0;
    unique->subtables = ABC_ALLOC(DdSubtable,unique->maxSize);
    if (unique->subtables == NULL) {
        ABC_FREE(unique);
        return(NULL);
    }
    unique->subtableZ = ABC_ALLOC(DdSubtable,unique->maxSizeZ);
    if (unique->subtableZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->perm = ABC_ALLOC(int,unique->maxSize);
    if (unique->perm == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->invperm = ABC_ALLOC(int,unique->maxSize);
    if (unique->invperm == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->permZ = ABC_ALLOC(int,unique->maxSizeZ);
    if (unique->permZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->invpermZ = ABC_ALLOC(int,unique->maxSizeZ);
    if (unique->invpermZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->map = NULL;
    unique->stack = ABC_ALLOC(DdNodePtr,ddMax(unique->maxSize,unique->maxSizeZ)+1);
    if (unique->stack == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->stack[0] = NULL; /* to suppress harmless UMR */

#ifndef DD_NO_DEATH_ROW
    unique->deathRowDepth = 1 << cuddComputeFloorLog2(unique->looseUpTo >> 2);
    unique->deathRow = ABC_ALLOC(DdNodePtr,unique->deathRowDepth);
    if (unique->deathRow == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique->stack);
        ABC_FREE(unique);
        return(NULL);
    }
    for (i = 0; i < unique->deathRowDepth; i++) {
        unique->deathRow[i] = NULL;
    }
    unique->nextDead = 0;
    unique->deadMask = unique->deathRowDepth - 1;
#endif

    for (i = 0; (unsigned) i < numVars; i++) {
        unique->subtables[i].slots = slots;
        unique->subtables[i].shift = shift;
        unique->subtables[i].keys = 0;
        unique->subtables[i].dead = 0;
        unique->subtables[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        unique->subtables[i].bindVar = 0;
        unique->subtables[i].varType = CUDD_VAR_PRIMARY_INPUT;
        unique->subtables[i].pairIndex = 0;
        unique->subtables[i].varHandled = 0;
        unique->subtables[i].varToBeGrouped = CUDD_LAZY_NONE;

        nodelist = unique->subtables[i].nodelist = ABC_ALLOC(DdNodePtr,slots);
        if (nodelist == NULL) {
            for (j = 0; j < i; j++) {
                ABC_FREE(unique->subtables[j].nodelist);
            }
            ABC_FREE(unique->subtables);
            ABC_FREE(unique->subtableZ);
            ABC_FREE(unique->perm);
            ABC_FREE(unique->invperm);
            ABC_FREE(unique->permZ);
            ABC_FREE(unique->invpermZ);
            ABC_FREE(unique->stack);
            ABC_FREE(unique);
            return(NULL);
        }
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = sentinel;
        }
        unique->perm[i] = i;
        unique->invperm[i] = i;
    }
    for (i = 0; (unsigned) i < numVarsZ; i++) {
        unique->subtableZ[i].slots = slots;
        unique->subtableZ[i].shift = shift;
        unique->subtableZ[i].keys = 0;
        unique->subtableZ[i].dead = 0;
        unique->subtableZ[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        nodelist = unique->subtableZ[i].nodelist = ABC_ALLOC(DdNodePtr,slots);
        if (nodelist == NULL) {
            for (j = 0; (unsigned) j < numVars; j++) {
                ABC_FREE(unique->subtables[j].nodelist);
            }
            ABC_FREE(unique->subtables);
            for (j = 0; j < i; j++) {
                ABC_FREE(unique->subtableZ[j].nodelist);
            }
            ABC_FREE(unique->subtableZ);
            ABC_FREE(unique->perm);
            ABC_FREE(unique->invperm);
            ABC_FREE(unique->permZ);
            ABC_FREE(unique->invpermZ);
            ABC_FREE(unique->stack);
            ABC_FREE(unique);
            return(NULL);
        }
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        unique->permZ[i] = i;
        unique->invpermZ[i] = i;
    }
    unique->constants.slots = slots;
    unique->constants.shift = shift;
    unique->constants.keys = 0;
    unique->constants.dead = 0;
    unique->constants.maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
    nodelist = unique->constants.nodelist = ABC_ALLOC(DdNodePtr,slots);
    if (nodelist == NULL) {
        for (j = 0; (unsigned) j < numVars; j++) {
            ABC_FREE(unique->subtables[j].nodelist);
        }
        ABC_FREE(unique->subtables);
        for (j = 0; (unsigned) j < numVarsZ; j++) {
            ABC_FREE(unique->subtableZ[j].nodelist);
        }
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique->stack);
        ABC_FREE(unique);
        return(NULL);
    }
    for (j = 0; (unsigned) j < slots; j++) {
        nodelist[j] = NULL;
    }

    unique->memoryList = NULL;
    unique->nextFree = NULL;

    unique->memused = sizeof(DdManager) + (unique->maxSize + unique->maxSizeZ)
        * (sizeof(DdSubtable) + 2 * sizeof(int)) + (numVars + 1) *
        slots * sizeof(DdNodePtr) +
        (ddMax(unique->maxSize,unique->maxSizeZ) + 1) * sizeof(DdNodePtr);
#ifndef DD_NO_DEATH_ROW
    unique->memused += unique->deathRowDepth * sizeof(DdNodePtr);
#endif

    /* Initialize fields concerned with automatic dynamic reordering */
    unique->reorderings = 0;
    unique->autoDyn = 0;        /* initially disabled */
    unique->autoDynZ = 0;       /* initially disabled */
    unique->realign = 0;        /* initially disabled */
    unique->realignZ = 0;       /* initially disabled */
    unique->reordered = 0;
    unique->autoMethod = CUDD_REORDER_SIFT;
    unique->autoMethodZ = CUDD_REORDER_SIFT;
    unique->nextDyn = DD_FIRST_REORDER;
    unique->countDead = ~0;
    unique->siftMaxVar = DD_SIFT_MAX_VAR;
    unique->siftMaxSwap = DD_SIFT_MAX_SWAPS;
    unique->tree = NULL;
    unique->treeZ = NULL;
    unique->groupcheck = CUDD_GROUP_CHECK7;
    unique->recomb = DD_DEFAULT_RECOMB;
    unique->symmviolation = 0;
    unique->arcviolation = 0;
    unique->populationSize = 0;
    unique->numberXovers = 0;
    unique->linear = NULL;
    unique->linearSize = 0;

    /* Initialize ZDD universe. */
    unique->univ = (DdNodePtr *)NULL;

    /* Initialize auxiliary fields. */
    unique->localCaches = NULL;
    unique->preGCHook = NULL;
    unique->postGCHook = NULL;
    unique->preReorderingHook = NULL;
    unique->postReorderingHook = NULL;
    unique->out = stdout;
    unique->err = stderr;
    unique->errorCode = CUDD_NO_ERROR;

    /* Initialize statistical counters. */
    unique->maxmemhard = ~ 0UL;
    unique->garbageCollections = 0;
    unique->GCTime = 0;
    unique->reordTime = 0;
#ifdef DD_STATS
    unique->nodesDropped = 0;
    unique->nodesFreed = 0;
#endif
    unique->peakLiveNodes = 0;
#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps = 0;
    unique->uniqueLinks = 0;
#endif
#ifdef DD_COUNT
    unique->recursiveCalls = 0;
    unique->swapSteps = 0;
#ifdef DD_STATS
    unique->nextSample = 250000;
#endif
#endif

    return(unique);

}